

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

Vec_Ptr_t * Llb_ManCutSupp(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  long lVar7;
  int iVar8;
  
  pVVar5 = Llb_ManCutNodes(p,vLower,vUpper);
  Aig_ManIncrementTravId(p);
  iVar8 = pVVar5->nSize;
  if (0 < (long)iVar8) {
    ppvVar6 = pVVar5->pArray;
    lVar7 = 0;
    do {
      pvVar4 = ppvVar6[lVar7];
      if ((*(uint *)((long)pvVar4 + 0x18) & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                      ,0x19b,"Vec_Ptr_t *Llb_ManCutSupp(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
      }
      iVar1 = p->nTravIds;
      *(int *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x20) = iVar1;
      *(int *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 0x20) = iVar1;
      lVar7 = lVar7 + 1;
    } while (iVar8 != lVar7);
  }
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (void **)0x0;
  }
  if (pVVar5 != (Vec_Ptr_t *)0x0) {
    free(pVVar5);
  }
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(800);
  pVVar5->pArray = ppvVar6;
  if (0 < vLower->nSize) {
    lVar7 = 0;
    do {
      pvVar4 = vLower->pArray[lVar7];
      if (*(int *)((long)pvVar4 + 0x20) == p->nTravIds) {
        uVar2 = pVVar5->nSize;
        uVar3 = pVVar5->nCap;
        if (uVar2 == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
            }
            iVar8 = 0x10;
          }
          else {
            iVar8 = uVar3 * 2;
            if (iVar8 <= (int)uVar3) goto LAB_00821507;
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc((ulong)uVar3 << 4);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,(ulong)uVar3 << 4);
            }
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = iVar8;
        }
LAB_00821507:
        pVVar5->nSize = uVar2 + 1;
        pVVar5->pArray[(int)uVar2] = pvVar4;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vLower->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Llb_ManCutSupp( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Vec_Ptr_t * vNodes, * vSupp;
    Aig_Obj_t * pObj;
    int i;
    vNodes = Llb_ManCutNodes( p, vLower, vUpper );
    // mark support of the nodes
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        Aig_ObjSetTravIdCurrent( p, Aig_ObjFanin0(pObj) );
        Aig_ObjSetTravIdCurrent( p, Aig_ObjFanin1(pObj) );
    }
    Vec_PtrFree( vNodes );
    // collect the support nodes
    vSupp = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        if ( Aig_ObjIsTravIdCurrent(p, pObj) )
            Vec_PtrPush( vSupp, pObj );
    return vSupp;

}